

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_test.cc
# Opt level: O1

int main(void)

{
  timeval __test_begin;
  
  system("rm -rf  filemgr_testfile");
  basic_test(0);
  basic_test(-1);
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"%s PASSED\n","multi threaded initialization test");
  return 0;
}

Assistant:

int main()
{
    int r = system(SHELL_DEL" filemgr_testfile");
    (void)r;

    basic_test(FDB_ENCRYPTION_NONE);
    basic_test(FDB_ENCRYPTION_BOGUS);
    mt_init_test();

    return 0;
}